

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O1

void aom_lpf_vertical_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [14];
  undefined1 auVar65 [12];
  unkbyte10 Var66;
  undefined1 auVar67 [12];
  unkbyte10 Var68;
  undefined1 auVar69 [12];
  undefined1 auVar70 [15];
  unkuint9 Var71;
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  unkuint9 Var74;
  undefined1 auVar75 [11];
  undefined1 auVar76 [15];
  unkuint9 Var77;
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [11];
  undefined1 auVar84 [13];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [11];
  undefined1 auVar89 [13];
  undefined1 auVar90 [14];
  undefined1 auVar91 [12];
  undefined1 auVar92 [14];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [14];
  undefined1 auVar96 [12];
  undefined1 auVar97 [14];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [14];
  long lVar111;
  byte bVar112;
  undefined1 auVar114 [14];
  undefined1 auVar115 [14];
  uint uVar113;
  byte bVar123;
  byte bVar126;
  byte bVar132;
  undefined4 uVar134;
  byte bVar135;
  byte bVar137;
  ushort uVar141;
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  byte bVar129;
  byte bVar139;
  undefined1 auVar119 [16];
  char cVar125;
  char cVar128;
  char cVar131;
  char cVar133;
  char cVar136;
  char cVar138;
  char cVar140;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  ushort uVar142;
  undefined1 auVar122 [16];
  undefined2 uVar143;
  short sVar152;
  undefined1 uVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined2 uVar447;
  undefined4 uVar173;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar170 [16];
  byte bVar174;
  byte bVar175;
  byte bVar208;
  byte bVar211;
  byte bVar213;
  byte bVar215;
  byte bVar218;
  byte bVar221;
  undefined1 auVar178 [14];
  ushort uVar176;
  undefined1 auVar177 [12];
  byte bVar200;
  ushort uVar201;
  byte bVar203;
  undefined4 uVar204;
  byte bVar205;
  byte bVar206;
  byte bVar209;
  byte bVar210;
  byte bVar212;
  byte bVar216;
  byte bVar222;
  undefined1 auVar180 [16];
  undefined1 auVar188 [16];
  byte bVar199;
  byte bVar202;
  byte bVar207;
  byte bVar214;
  byte bVar217;
  byte bVar219;
  byte bVar220;
  byte bVar223;
  byte bVar226;
  byte bVar227;
  undefined1 auVar189 [16];
  undefined1 auVar179 [14];
  byte bVar224;
  byte bVar228;
  ushort uVar225;
  undefined1 auVar190 [16];
  undefined1 auVar197 [16];
  undefined2 uVar229;
  undefined4 uVar230;
  undefined1 auVar235 [14];
  short sVar239;
  short sVar240;
  undefined4 uVar241;
  short sVar242;
  short sVar243;
  undefined4 uVar244;
  short sVar245;
  short sVar246;
  undefined1 uVar247;
  undefined1 auVar238 [16];
  short sVar248;
  undefined4 uVar249;
  undefined1 auVar251 [12];
  short sVar270;
  undefined4 uVar271;
  short sVar273;
  short sVar275;
  undefined1 auVar252 [16];
  uint uVar276;
  undefined1 auVar260 [16];
  short sVar269;
  short sVar272;
  short sVar274;
  short sVar277;
  undefined1 auVar262 [16];
  byte bVar278;
  ushort uVar280;
  short sVar301;
  short sVar302;
  ushort uVar303;
  short sVar306;
  short sVar307;
  ushort uVar308;
  short sVar309;
  short sVar310;
  short sVar311;
  ushort uVar312;
  short sVar315;
  short sVar316;
  ushort uVar317;
  short sVar321;
  short sVar322;
  ushort uVar323;
  short sVar326;
  short sVar327;
  short sVar328;
  ushort uVar329;
  undefined1 auVar282 [14];
  ushort uVar324;
  ushort uVar330;
  undefined1 auVar283 [14];
  byte bVar298;
  short sVar279;
  undefined2 uVar448;
  ulong uVar281;
  byte bVar299;
  byte bVar304;
  short sVar300;
  short sVar305;
  byte bVar313;
  byte bVar318;
  short sVar314;
  byte bVar319;
  byte bVar325;
  short sVar320;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  short sVar331;
  short sVar332;
  ushort uVar333;
  ushort uVar334;
  undefined1 auVar294 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  ushort uVar337;
  ushort uVar338;
  ushort uVar356;
  short sVar357;
  ushort uVar358;
  short sVar359;
  undefined1 auVar340 [14];
  undefined1 auVar339 [12];
  short sVar352;
  short sVar353;
  short sVar354;
  short sVar355;
  undefined1 auVar341 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  short sVar360;
  short sVar361;
  short sVar362;
  short sVar363;
  short sVar364;
  short sVar365;
  undefined1 auVar366 [14];
  undefined1 auVar367 [14];
  undefined1 auVar368 [14];
  undefined1 auVar369 [16];
  ushort uVar377;
  undefined1 auVar370 [16];
  undefined1 auVar379 [14];
  undefined1 auVar378 [12];
  undefined1 in_XMM11 [16];
  undefined1 auVar380 [16];
  undefined1 auVar388 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar393 [16];
  short sVar405;
  short sVar409;
  undefined1 auVar401 [12];
  short sVar406;
  short sVar407;
  short sVar408;
  short sVar410;
  short sVar411;
  short sVar412;
  short sVar413;
  undefined1 auVar402 [14];
  undefined1 auVar403 [14];
  short sVar414;
  short sVar422;
  undefined1 auVar415 [14];
  short sVar417;
  short sVar418;
  short sVar419;
  short sVar420;
  short sVar421;
  short sVar423;
  short sVar424;
  short sVar425;
  short sVar426;
  undefined1 auVar416 [16];
  short sVar427;
  byte bVar430;
  undefined1 auVar429 [16];
  short sVar431;
  short sVar432;
  short sVar433;
  short sVar438;
  short sVar439;
  short sVar440;
  short sVar441;
  short sVar442;
  short sVar443;
  short sVar444;
  short sVar445;
  short sVar446;
  undefined1 auVar434 [16];
  undefined1 auVar117 [16];
  byte bVar124;
  byte bVar127;
  byte bVar130;
  undefined6 uVar144;
  undefined8 uVar145;
  undefined1 auVar146 [12];
  undefined1 auVar147 [16];
  undefined1 auVar163 [16];
  undefined1 auVar156 [16];
  undefined1 auVar164 [16];
  undefined1 auVar157 [16];
  undefined1 auVar165 [16];
  undefined1 auVar171 [16];
  undefined1 auVar158 [16];
  undefined1 auVar166 [16];
  undefined1 auVar159 [16];
  undefined1 auVar167 [16];
  undefined1 auVar172 [16];
  undefined1 auVar160 [16];
  undefined1 auVar168 [16];
  undefined1 auVar161 [16];
  undefined1 auVar169 [16];
  undefined1 auVar162 [16];
  undefined1 auVar181 [16];
  undefined1 auVar191 [16];
  undefined1 auVar182 [16];
  undefined1 auVar192 [16];
  undefined1 auVar183 [16];
  undefined1 auVar193 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar194 [16];
  undefined1 auVar185 [16];
  undefined1 auVar195 [16];
  undefined1 auVar186 [16];
  undefined1 auVar196 [16];
  undefined1 uVar198;
  undefined6 uVar231;
  undefined8 uVar232;
  undefined1 auVar234 [12];
  undefined1 auVar233 [12];
  undefined1 auVar237 [16];
  undefined1 auVar236 [16];
  undefined1 auVar250 [12];
  undefined1 auVar253 [16];
  undefined1 auVar263 [16];
  undefined1 auVar254 [16];
  undefined1 auVar264 [16];
  undefined1 auVar255 [16];
  undefined1 auVar265 [16];
  undefined1 auVar256 [16];
  undefined1 auVar259 [16];
  undefined1 auVar261 [16];
  undefined1 auVar266 [16];
  undefined1 auVar257 [16];
  undefined1 auVar267 [16];
  undefined1 auVar258 [16];
  undefined1 auVar268 [16];
  undefined1 auVar287 [16];
  undefined1 auVar295 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar296 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar297 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar286 [16];
  undefined1 auVar342 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar351 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar381 [16];
  undefined1 auVar389 [16];
  undefined1 auVar392 [16];
  undefined1 auVar382 [16];
  undefined1 auVar394 [16];
  undefined1 auVar383 [16];
  undefined1 auVar395 [16];
  undefined1 auVar384 [16];
  undefined1 auVar396 [16];
  undefined1 auVar385 [16];
  undefined1 auVar397 [16];
  undefined1 auVar400 [16];
  undefined1 auVar386 [16];
  undefined1 auVar398 [16];
  undefined1 auVar387 [16];
  undefined1 auVar399 [16];
  undefined1 auVar404 [16];
  undefined1 auVar428 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  
  auVar122 = *(undefined1 (*) [16])(s + -8);
  lVar111 = (long)p;
  puVar1 = s + lVar111 + -8;
  uVar56 = puVar1[1];
  uVar57 = puVar1[0xe];
  auVar265 = *(undefined1 (*) [16])(s + lVar111 * 2 + -8);
  lVar3 = lVar111 * 3;
  puVar2 = s + lVar3 + -8;
  uVar58 = puVar2[1];
  uVar59 = puVar2[0xe];
  auVar258._0_14_ = auVar122._0_14_;
  auVar258[0xe] = auVar122[7];
  auVar258[0xf] = puVar1[7];
  auVar257._14_2_ = auVar258._14_2_;
  auVar257._0_13_ = auVar122._0_13_;
  auVar257[0xd] = puVar1[6];
  auVar256._13_3_ = auVar257._13_3_;
  auVar256._0_12_ = auVar122._0_12_;
  auVar256[0xc] = auVar122[6];
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._0_11_ = auVar122._0_11_;
  auVar255[0xb] = puVar1[5];
  auVar254._11_5_ = auVar255._11_5_;
  auVar254._0_10_ = auVar122._0_10_;
  auVar254[10] = auVar122[5];
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._0_9_ = auVar122._0_9_;
  auVar253[9] = puVar1[4];
  auVar252._9_7_ = auVar253._9_7_;
  auVar252._0_8_ = auVar122._0_8_;
  auVar252[8] = auVar122[4];
  Var66 = CONCAT91(CONCAT81(auVar252._8_8_,puVar1[3]),auVar122[3]);
  auVar65._2_10_ = Var66;
  auVar65[1] = puVar1[2];
  auVar65[0] = auVar122[2];
  auVar64._2_12_ = auVar65;
  auVar64[1] = uVar56;
  auVar64[0] = auVar122[1];
  auVar118._14_2_ = 0;
  auVar118._0_14_ = auVar64;
  auVar118 = auVar118 << 0x10;
  auVar186._0_14_ = auVar265._0_14_;
  auVar186[0xe] = auVar265[7];
  auVar186[0xf] = puVar2[7];
  auVar185._14_2_ = auVar186._14_2_;
  auVar185._0_13_ = auVar265._0_13_;
  auVar185[0xd] = puVar2[6];
  auVar184._13_3_ = auVar185._13_3_;
  auVar184._0_12_ = auVar265._0_12_;
  auVar184[0xc] = auVar265[6];
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._0_11_ = auVar265._0_11_;
  auVar183[0xb] = puVar2[5];
  auVar182._11_5_ = auVar183._11_5_;
  auVar182._0_10_ = auVar265._0_10_;
  auVar182[10] = auVar265[5];
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._0_9_ = auVar265._0_9_;
  auVar181[9] = puVar2[4];
  auVar180._9_7_ = auVar181._9_7_;
  auVar180._0_8_ = auVar265._0_8_;
  auVar180[8] = auVar265[4];
  Var68 = CONCAT91(CONCAT81(auVar180._8_8_,puVar2[3]),auVar265[3]);
  auVar67._2_10_ = Var68;
  auVar67[1] = puVar2[2];
  auVar67[0] = auVar265[2];
  auVar379._2_12_ = auVar67;
  auVar379[1] = uVar58;
  uVar198 = auVar265[1];
  auVar379[0] = uVar198;
  uVar229 = CONCAT11(puVar1[8],auVar122[8]);
  uVar173 = CONCAT13(puVar1[9],CONCAT12(auVar122[9],uVar229));
  uVar231 = CONCAT15(puVar1[10],CONCAT14(auVar122[10],uVar173));
  uVar232 = CONCAT17(puVar1[0xb],CONCAT16(auVar122[0xb],uVar231));
  auVar233._0_10_ = CONCAT19(puVar1[0xc],CONCAT18(auVar122[0xc],uVar232));
  auVar233[10] = auVar122[0xd];
  auVar233[0xb] = puVar1[0xd];
  uVar247 = auVar122[0xe];
  auVar367[0xc] = uVar247;
  auVar367._0_12_ = auVar233;
  auVar367[0xd] = uVar57;
  auVar236[0xe] = auVar122[0xf];
  auVar236._0_14_ = auVar367;
  auVar236[0xf] = puVar1[0xf];
  uVar143 = CONCAT11(puVar2[8],auVar265[8]);
  uVar134 = CONCAT13(puVar2[9],CONCAT12(auVar265[9],uVar143));
  uVar144 = CONCAT15(puVar2[10],CONCAT14(auVar265[10],uVar134));
  uVar145 = CONCAT17(puVar2[0xb],CONCAT16(auVar265[0xb],uVar144));
  auVar146._0_10_ = CONCAT19(puVar2[0xc],CONCAT18(auVar265[0xc],uVar145));
  auVar146[10] = auVar265[0xd];
  auVar146[0xb] = puVar2[0xd];
  uVar153 = auVar265[0xe];
  auVar403[0xc] = uVar153;
  auVar403._0_12_ = auVar146;
  auVar403[0xd] = uVar59;
  auVar147[0xe] = auVar265[0xf];
  auVar147._0_14_ = auVar403;
  auVar147[0xf] = puVar2[0xf];
  uVar338 = (ushort)Var66;
  auVar437._0_12_ = auVar118._0_12_;
  auVar437._12_2_ = uVar338;
  auVar437._14_2_ = (short)Var68;
  auVar436._12_4_ = auVar437._12_4_;
  auVar436._0_10_ = auVar118._0_10_;
  auVar436._10_2_ = auVar67._0_2_;
  auVar435._10_6_ = auVar436._10_6_;
  auVar435._0_8_ = auVar118._0_8_;
  auVar435._8_2_ = auVar65._0_2_;
  auVar69._4_8_ = auVar435._8_8_;
  auVar69._2_2_ = auVar379._0_2_;
  auVar69._0_2_ = auVar64._0_2_;
  auVar434._12_4_ = 0;
  auVar434._0_12_ = auVar69;
  auVar434 = auVar434 << 0x20;
  uVar176 = auVar252._8_2_;
  uVar249 = CONCAT22(auVar180._8_2_,uVar176);
  uVar201 = auVar254._10_2_;
  auVar250._0_8_ = CONCAT26(auVar182._10_2_,CONCAT24(uVar201,uVar249));
  uVar356 = auVar256._12_2_;
  auVar250._8_2_ = uVar356;
  auVar250._10_2_ = auVar184._12_2_;
  auVar259._12_2_ = auVar257._14_2_;
  auVar259._0_12_ = auVar250;
  auVar259._14_2_ = auVar185._14_2_;
  auVar188._12_2_ = (short)((ulong)uVar232 >> 0x30);
  auVar188._0_12_ = auVar233;
  auVar188._14_2_ = (short)((ulong)uVar145 >> 0x30);
  auVar285._12_4_ = auVar188._12_4_;
  auVar285._10_2_ = (short)((uint6)uVar144 >> 0x20);
  auVar285._0_10_ = auVar233._0_10_;
  auVar335._10_6_ = auVar285._10_6_;
  auVar335._8_2_ = (short)((uint6)uVar231 >> 0x20);
  auVar335._0_8_ = uVar232;
  auVar154._8_8_ = auVar335._8_8_;
  auVar154._6_2_ = (short)((uint)uVar134 >> 0x10);
  auVar154._0_6_ = uVar231;
  auVar117._6_10_ = auVar154._6_10_;
  auVar117._4_2_ = (short)((uint)uVar173 >> 0x10);
  auVar117._0_4_ = uVar173;
  auVar116._4_12_ = auVar117._4_12_;
  auVar116._0_4_ = CONCAT22(uVar143,uVar229);
  uVar230 = CONCAT22((short)((unkuint10)auVar146._0_10_ >> 0x40),
                     (short)((unkuint10)auVar233._0_10_ >> 0x40));
  auVar234._0_8_ = CONCAT26(auVar146._10_2_,CONCAT24(auVar233._10_2_,uVar230));
  auVar234._8_2_ = auVar367._12_2_;
  auVar234._10_2_ = auVar403._12_2_;
  auVar237._12_2_ = auVar236._14_2_;
  auVar237._0_12_ = auVar234;
  auVar237._14_2_ = auVar147._14_2_;
  uVar241 = (undefined4)((ulong)auVar234._0_8_ >> 0x20);
  uVar244 = auVar234._8_4_;
  uVar173 = auVar435._8_4_;
  uVar271 = (undefined4)((ulong)auVar250._0_8_ >> 0x20);
  uVar204 = auVar250._8_4_;
  uVar276 = auVar259._12_4_;
  auVar401._0_8_ = CONCAT44(auVar335._8_4_,uVar271);
  auVar401._8_4_ = uVar204;
  auVar404._12_4_ = auVar285._12_4_;
  auVar404._0_12_ = auVar401;
  auVar367 = auVar404._0_14_;
  uVar134 = auVar117._4_4_;
  auVar429._4_8_ = 0;
  auVar429._0_4_ = uVar276;
  auVar429._12_4_ = uVar134;
  auVar428._8_8_ = auVar429._8_8_;
  auVar428._0_8_ = CONCAT44(auVar116._0_4_,uVar276);
  auVar260._0_8_ = CONCAT44(uVar204,uVar276);
  auVar260._8_4_ = auVar116._0_4_;
  auVar260._12_4_ = uVar134;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = auVar116._0_8_;
  uVar145 = CONCAT44(auVar285._12_4_,uVar249);
  auVar4._8_4_ = uVar271;
  auVar4._0_8_ = uVar145;
  auVar416._12_4_ = 0;
  auVar416._0_12_ = auVar4;
  auVar179._12_2_ = 0;
  auVar179._0_12_ = auVar4;
  auVar177._0_8_ = CONCAT44(uVar134,uVar204);
  auVar177._8_4_ = uVar276;
  auVar187._12_4_ = auVar335._8_4_;
  auVar187._0_12_ = auVar177;
  auVar118 = psubusb(auVar187,auVar428);
  auVar335 = psubusb(auVar428,auVar187);
  auVar335 = auVar335 | auVar118;
  auVar148._8_4_ = auVar116._0_4_;
  auVar148._0_8_ = auVar260._0_8_;
  auVar148._12_4_ = uVar134;
  auVar118 = psubusb(auVar148,auVar341);
  auVar154 = psubusb(auVar341,auVar260);
  auVar154 = auVar154 | auVar118;
  bVar208 = auVar335[0];
  bVar430 = auVar335[4];
  bVar112 = (bVar430 < bVar208) * bVar208 | (bVar430 >= bVar208) * bVar430;
  bVar211 = auVar335[1];
  bVar124 = auVar335[5];
  bVar123 = (bVar124 < bVar211) * bVar211 | (bVar124 >= bVar211) * bVar124;
  bVar213 = auVar335[2];
  bVar127 = auVar335[6];
  bVar126 = (bVar127 < bVar213) * bVar213 | (bVar127 >= bVar213) * bVar127;
  bVar215 = auVar335[3];
  bVar130 = auVar335[7];
  bVar129 = (bVar130 < bVar215) * bVar215 | (bVar130 >= bVar215) * bVar130;
  bVar175 = auVar335[8];
  bVar132 = (bVar175 < bVar430) * bVar430 | (bVar175 >= bVar430) * bVar175;
  bVar174 = auVar335[9];
  bVar135 = (bVar174 < bVar124) * bVar124 | (bVar174 >= bVar124) * bVar174;
  bVar199 = auVar335[10];
  bVar137 = (bVar199 < bVar127) * bVar127 | (bVar199 >= bVar127) * bVar199;
  bVar200 = auVar335[0xb];
  bVar139 = (bVar200 < bVar130) * bVar130 | (bVar200 >= bVar130) * bVar200;
  bVar217 = *_thresh;
  bVar220 = _thresh[1];
  bVar223 = _thresh[2];
  bVar227 = _thresh[3];
  bVar218 = _thresh[4];
  bVar221 = _thresh[5];
  bVar224 = _thresh[6];
  bVar228 = _thresh[7];
  uVar113 = CONCAT13(-((byte)((bVar129 < bVar227) * bVar129 | (bVar129 >= bVar227) * bVar227) ==
                      bVar129),
                     CONCAT12(-((byte)((bVar126 < bVar223) * bVar126 |
                                      (bVar126 >= bVar223) * bVar223) == bVar126),
                              CONCAT11(-((byte)((bVar123 < bVar220) * bVar123 |
                                               (bVar123 >= bVar220) * bVar220) == bVar123),
                                       -((byte)((bVar112 < bVar217) * bVar112 |
                                               (bVar112 >= bVar217) * bVar217) == bVar112))));
  auVar284._0_2_ = auVar154._4_2_ >> 1;
  auVar284._2_2_ = auVar154._6_2_ >> 1;
  auVar284._4_2_ = auVar154._8_2_ >> 1;
  auVar284._6_2_ = auVar154._10_2_ >> 1;
  auVar284._8_2_ = auVar154._12_2_ >> 1;
  auVar284._10_2_ = auVar154._14_2_ >> 1;
  auVar284._12_4_ = 0;
  auVar118 = paddusb(auVar154,auVar154);
  auVar118 = paddusb(auVar284 & _DAT_004d14d0,auVar118);
  auVar285 = psubusb(auVar118,*(undefined1 (*) [16])_blimit);
  auVar118 = psubusb(auVar404,auVar187);
  auVar154 = psubusb(auVar187,auVar404);
  auVar154 = auVar154 | auVar118;
  auVar118 = psubusb(auVar416,auVar404);
  auVar188 = psubusb(auVar404,auVar416);
  auVar188 = auVar188 | auVar118;
  uVar281 = auVar285._0_8_ & 0xffffffff;
  bVar217 = -((char)uVar281 == '\0') ^ 0xff;
  bVar220 = -((char)(uVar281 >> 8) == '\0') ^ 0xff;
  bVar223 = -((char)(uVar281 >> 0x10) == '\0') ^ 0xff;
  bVar227 = -((char)(uVar281 >> 0x18) == '\0') ^ 0xff;
  bVar112 = -(auVar285[4] == '\0') ^ 0xff;
  bVar123 = -(auVar285[5] == '\0') ^ 0xff;
  bVar126 = -(auVar285[6] == '\0') ^ 0xff;
  bVar202 = -(auVar285[7] == '\0') ^ 0xff;
  bVar278 = (bVar217 < bVar208) * bVar208 | (bVar217 >= bVar208) * bVar217;
  bVar298 = (bVar220 < bVar211) * bVar211 | (bVar220 >= bVar211) * bVar220;
  bVar299 = (bVar223 < bVar213) * bVar213 | (bVar223 >= bVar213) * bVar223;
  bVar304 = (bVar227 < bVar215) * bVar215 | (bVar227 >= bVar215) * bVar227;
  bVar129 = (bVar430 != 0) * bVar430;
  bVar217 = (bVar124 != 0) * bVar124;
  bVar220 = (bVar127 != 0) * bVar127;
  bVar223 = (bVar130 != 0) * bVar130;
  bVar313 = (bVar112 < bVar175) * bVar175 | (bVar112 >= bVar175) * bVar112;
  bVar318 = (bVar123 < bVar174) * bVar174 | (bVar123 >= bVar174) * bVar123;
  bVar319 = (bVar126 < bVar199) * bVar199 | (bVar126 >= bVar199) * bVar126;
  bVar325 = (bVar202 < bVar200) * bVar200 | (bVar202 >= bVar200) * bVar202;
  bVar227 = (auVar335[0xc] != '\0') * auVar335[0xc];
  bVar112 = (auVar335[0xd] != '\0') * auVar335[0xd];
  bVar123 = (auVar335[0xe] != '\0') * auVar335[0xe];
  bVar126 = (auVar335[0xf] != '\0') * auVar335[0xf];
  bVar175 = auVar154[0];
  bVar174 = auVar188[0];
  bVar174 = (bVar174 < bVar175) * bVar175 | (bVar174 >= bVar175) * bVar174;
  bVar175 = auVar154[1];
  bVar199 = auVar188[1];
  bVar199 = (bVar199 < bVar175) * bVar175 | (bVar199 >= bVar175) * bVar199;
  bVar175 = auVar154[2];
  bVar200 = auVar188[2];
  bVar200 = (bVar200 < bVar175) * bVar175 | (bVar200 >= bVar175) * bVar200;
  bVar175 = auVar154[3];
  bVar202 = auVar188[3];
  bVar202 = (bVar202 < bVar175) * bVar175 | (bVar202 >= bVar175) * bVar202;
  bVar175 = auVar154[4];
  bVar203 = auVar188[4];
  bVar203 = (bVar203 < bVar175) * bVar175 | (bVar203 >= bVar175) * bVar203;
  bVar175 = auVar154[5];
  bVar205 = auVar188[5];
  bVar205 = (bVar205 < bVar175) * bVar175 | (bVar205 >= bVar175) * bVar205;
  bVar175 = auVar154[6];
  bVar206 = auVar188[6];
  bVar206 = (bVar206 < bVar175) * bVar175 | (bVar206 >= bVar175) * bVar206;
  bVar175 = auVar154[7];
  bVar207 = auVar188[7];
  bVar207 = (bVar207 < bVar175) * bVar175 | (bVar207 >= bVar175) * bVar207;
  bVar175 = auVar154[8];
  bVar209 = auVar188[8];
  bVar209 = (bVar209 < bVar175) * bVar175 | (bVar209 >= bVar175) * bVar209;
  bVar175 = auVar154[9];
  bVar210 = auVar188[9];
  bVar210 = (bVar210 < bVar175) * bVar175 | (bVar210 >= bVar175) * bVar210;
  bVar175 = auVar154[10];
  bVar212 = auVar188[10];
  bVar212 = (bVar212 < bVar175) * bVar175 | (bVar212 >= bVar175) * bVar212;
  bVar175 = auVar154[0xb];
  bVar214 = auVar188[0xb];
  bVar214 = (bVar214 < bVar175) * bVar175 | (bVar214 >= bVar175) * bVar214;
  bVar175 = auVar154[0xc];
  bVar216 = auVar188[0xc];
  bVar216 = (bVar216 < bVar175) * bVar175 | (bVar216 >= bVar175) * bVar216;
  bVar175 = auVar154[0xd];
  bVar219 = auVar188[0xd];
  bVar219 = (bVar219 < bVar175) * bVar175 | (bVar219 >= bVar175) * bVar219;
  bVar175 = auVar154[0xe];
  bVar222 = auVar188[0xe];
  bVar226 = auVar188[0xf];
  bVar222 = (bVar222 < bVar175) * bVar175 | (bVar222 >= bVar175) * bVar222;
  bVar175 = auVar154[0xf];
  bVar226 = (bVar226 < bVar175) * bVar175 | (bVar226 >= bVar175) * bVar226;
  bVar175 = (bVar174 < bVar278) * bVar278 | (bVar174 >= bVar278) * bVar174;
  bVar174 = (bVar199 < bVar298) * bVar298 | (bVar199 >= bVar298) * bVar199;
  bVar199 = (bVar200 < bVar299) * bVar299 | (bVar200 >= bVar299) * bVar200;
  bVar200 = (bVar202 < bVar304) * bVar304 | (bVar202 >= bVar304) * bVar202;
  bVar129 = (bVar203 < bVar129) * bVar129 | (bVar203 >= bVar129) * bVar203;
  bVar202 = (bVar205 < bVar217) * bVar217 | (bVar205 >= bVar217) * bVar205;
  bVar203 = (bVar206 < bVar220) * bVar220 | (bVar206 >= bVar220) * bVar206;
  bVar205 = (bVar207 < bVar223) * bVar223 | (bVar207 >= bVar223) * bVar207;
  bVar206 = (bVar209 < bVar313) * bVar313 | (bVar209 >= bVar313) * bVar209;
  bVar207 = (bVar210 < bVar318) * bVar318 | (bVar210 >= bVar318) * bVar210;
  bVar209 = (bVar212 < bVar319) * bVar319 | (bVar212 >= bVar319) * bVar212;
  bVar210 = (bVar214 < bVar325) * bVar325 | (bVar214 >= bVar325) * bVar214;
  bVar217 = (bVar216 < bVar227) * bVar227 | (bVar216 >= bVar227) * bVar216;
  bVar220 = (bVar219 < bVar112) * bVar112 | (bVar219 >= bVar112) * bVar219;
  bVar223 = (bVar222 < bVar123) * bVar123 | (bVar222 >= bVar123) * bVar222;
  bVar227 = (bVar226 < bVar126) * bVar126 | (bVar226 >= bVar126) * bVar226;
  bVar214 = (bVar129 < bVar175) * bVar175 | (bVar129 >= bVar175) * bVar129;
  bVar216 = (bVar202 < bVar174) * bVar174 | (bVar202 >= bVar174) * bVar202;
  bVar219 = (bVar203 < bVar199) * bVar199 | (bVar203 >= bVar199) * bVar203;
  bVar222 = (bVar205 < bVar200) * bVar200 | (bVar205 >= bVar200) * bVar205;
  bVar226 = (bVar206 < bVar129) * bVar129 | (bVar206 >= bVar129) * bVar206;
  bVar278 = (bVar207 < bVar202) * bVar202 | (bVar207 >= bVar202) * bVar207;
  bVar298 = (bVar209 < bVar203) * bVar203 | (bVar209 >= bVar203) * bVar209;
  bVar299 = (bVar210 < bVar205) * bVar205 | (bVar210 >= bVar205) * bVar210;
  bVar304 = (bVar217 < bVar206) * bVar206 | (bVar217 >= bVar206) * bVar217;
  bVar313 = (bVar220 < bVar207) * bVar207 | (bVar220 >= bVar207) * bVar220;
  bVar318 = (bVar223 < bVar209) * bVar209 | (bVar223 >= bVar209) * bVar223;
  bVar319 = (bVar227 < bVar210) * bVar210 | (bVar227 >= bVar210) * bVar227;
  bVar217 = (bVar217 != 0) * bVar217;
  bVar220 = (bVar220 != 0) * bVar220;
  bVar223 = (bVar223 != 0) * bVar223;
  bVar227 = (bVar227 != 0) * bVar227;
  bVar112 = *_limit;
  bVar123 = _limit[1];
  bVar126 = _limit[2];
  bVar129 = _limit[3];
  bVar175 = _limit[4];
  bVar174 = _limit[5];
  bVar199 = _limit[6];
  bVar200 = _limit[7];
  bVar202 = _limit[8];
  bVar203 = _limit[9];
  bVar205 = _limit[10];
  bVar206 = _limit[0xb];
  bVar207 = _limit[0xc];
  bVar209 = _limit[0xd];
  bVar210 = _limit[0xe];
  bVar212 = _limit[0xf];
  auVar369._0_4_ =
       CONCAT13(-((byte)((bVar222 < bVar129) * bVar222 | (bVar222 >= bVar129) * bVar129) == bVar222)
                ,CONCAT12(-((byte)((bVar219 < bVar126) * bVar219 | (bVar219 >= bVar126) * bVar126)
                           == bVar219),
                          CONCAT11(-((byte)((bVar216 < bVar123) * bVar216 |
                                           (bVar216 >= bVar123) * bVar123) == bVar216),
                                   -((byte)((bVar214 < bVar112) * bVar214 |
                                           (bVar214 >= bVar112) * bVar112) == bVar214))));
  auVar369[4] = -((byte)((bVar226 < bVar175) * bVar226 | (bVar226 >= bVar175) * bVar175) == bVar226)
  ;
  auVar369[5] = -((byte)((bVar278 < bVar174) * bVar278 | (bVar278 >= bVar174) * bVar174) == bVar278)
  ;
  auVar369[6] = -((byte)((bVar298 < bVar199) * bVar298 | (bVar298 >= bVar199) * bVar199) == bVar298)
  ;
  auVar369[7] = -((byte)((bVar299 < bVar200) * bVar299 | (bVar299 >= bVar200) * bVar200) == bVar299)
  ;
  auVar369[8] = -((byte)((bVar304 < bVar202) * bVar304 | (bVar304 >= bVar202) * bVar202) == bVar304)
  ;
  auVar369[9] = -((byte)((bVar313 < bVar203) * bVar313 | (bVar313 >= bVar203) * bVar203) == bVar313)
  ;
  auVar369[10] = -((byte)((bVar318 < bVar205) * bVar318 | (bVar318 >= bVar205) * bVar205) == bVar318
                  );
  auVar369[0xb] =
       -((byte)((bVar319 < bVar206) * bVar319 | (bVar319 >= bVar206) * bVar206) == bVar319);
  auVar369[0xc] =
       -((byte)((bVar217 < bVar207) * bVar217 | (bVar217 >= bVar207) * bVar207) == bVar217);
  auVar369[0xd] =
       -((byte)((bVar220 < bVar209) * bVar220 | (bVar220 >= bVar209) * bVar209) == bVar220);
  auVar369[0xe] =
       -((byte)((bVar223 < bVar210) * bVar223 | (bVar223 >= bVar210) * bVar210) == bVar223);
  auVar369[0xf] =
       -((byte)((bVar227 < bVar212) * bVar227 | (bVar227 >= bVar212) * bVar212) == bVar227);
  auVar118 = psubsb(auVar260 ^ _DAT_004d2840,auVar341 ^ _DAT_004d2840);
  uVar134 = (undefined4)
            (CONCAT17(-((byte)((bVar139 < bVar228) * bVar139 | (bVar139 >= bVar228) * bVar228) ==
                       bVar139),
                      CONCAT16(-((byte)((bVar137 < bVar224) * bVar137 |
                                       (bVar137 >= bVar224) * bVar224) == bVar137),
                               CONCAT15(-((byte)((bVar135 < bVar221) * bVar135 |
                                                (bVar135 >= bVar221) * bVar221) == bVar135),
                                        CONCAT14(-((byte)((bVar132 < bVar218) * bVar132 |
                                                         (bVar132 >= bVar218) * bVar218) == bVar132)
                                                 ,uVar113)))) >> 0x20);
  auVar189._4_4_ = uVar113;
  auVar189._0_4_ = uVar113;
  auVar189._8_4_ = uVar134;
  auVar189._12_4_ = uVar134;
  auVar154 = psubsb(~auVar189 & auVar118 >> 0x20,auVar118);
  auVar154 = psubsb(auVar154,auVar118);
  auVar118 = psubsb(auVar154,auVar118);
  uVar134 = SUB164(auVar118 & auVar369,0);
  uVar204 = SUB164(auVar118 & auVar369,4);
  auVar119._4_4_ = uVar134;
  auVar119._0_4_ = uVar134;
  auVar119._8_4_ = uVar204;
  auVar119._12_4_ = uVar204;
  auVar118 = paddsb(auVar119,_DAT_005165b0);
  auVar387._0_14_ = in_XMM11._0_14_;
  auVar387[0xe] = in_XMM11[7];
  auVar387[0xf] = auVar118[7];
  auVar386._14_2_ = auVar387._14_2_;
  auVar386._0_13_ = in_XMM11._0_13_;
  auVar386[0xd] = auVar118[6];
  auVar385._13_3_ = auVar386._13_3_;
  auVar385._0_12_ = in_XMM11._0_12_;
  auVar385[0xc] = in_XMM11[6];
  auVar384._12_4_ = auVar385._12_4_;
  auVar384._0_11_ = in_XMM11._0_11_;
  auVar384[0xb] = auVar118[5];
  auVar383._11_5_ = auVar384._11_5_;
  auVar383._0_10_ = in_XMM11._0_10_;
  auVar383[10] = in_XMM11[5];
  auVar382._10_6_ = auVar383._10_6_;
  auVar382._0_9_ = in_XMM11._0_9_;
  auVar382[9] = auVar118[4];
  auVar381._9_7_ = auVar382._9_7_;
  auVar381._0_8_ = in_XMM11._0_8_;
  auVar381[8] = in_XMM11[4];
  auVar380._8_8_ = auVar381._8_8_;
  auVar380[7] = auVar118[3];
  auVar380[6] = in_XMM11[3];
  auVar380[5] = auVar118[2];
  auVar380[4] = in_XMM11[2];
  auVar380[3] = auVar118[1];
  auVar380[2] = in_XMM11[1];
  auVar380[0] = in_XMM11[0];
  auVar380[1] = auVar118[0];
  auVar118 = psraw(auVar380,0xb);
  auVar154 = packsswb(auVar118,auVar118);
  auVar120[0] = auVar154[0] + '\x01';
  cVar125 = auVar154[1] + '\x01';
  cVar128 = auVar154[2] + '\x01';
  cVar131 = auVar154[3] + '\x01';
  cVar133 = auVar154[4] + '\x01';
  cVar136 = auVar154[5] + '\x01';
  cVar138 = auVar154[6] + '\x01';
  cVar140 = auVar154[7] + '\x01';
  auVar120._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar140,cVar140),cVar138),
                                                     cVar138),cVar136),cVar136),cVar133),
                 CONCAT11(cVar133,cVar140)) >> 8);
  auVar120[7] = cVar131;
  auVar120[6] = cVar131;
  auVar120[5] = cVar128;
  auVar120[4] = cVar128;
  auVar120[3] = cVar125;
  auVar120[2] = cVar125;
  auVar120[1] = auVar120[0];
  auVar118 = psraw(auVar120,9);
  auVar118 = packsswb(auVar118,auVar118);
  uVar113 = auVar118._0_4_ & uVar113;
  auVar389._0_8_ = auVar154._0_8_;
  auVar389._8_4_ = auVar154._4_4_;
  auVar389._12_4_ = uVar113;
  auVar388._8_8_ = auVar389._8_8_;
  auVar388._0_4_ = auVar154._0_4_;
  auVar388._4_4_ = uVar113;
  auVar118 = psubsb(auVar341 ^ _DAT_004d2840,auVar388);
  auVar390._8_8_ = 0;
  auVar390._0_8_ = auVar388._8_8_;
  auVar154 = paddsb(auVar390,auVar260 ^ _DAT_004d2840);
  auVar392._0_8_ = auVar154._0_8_;
  auVar392._8_4_ = auVar154._4_4_;
  auVar392._12_4_ = auVar118._4_4_;
  auVar391._8_8_ = auVar392._8_8_;
  auVar391._0_4_ = auVar154._0_4_;
  auVar391._4_4_ = auVar118._0_4_;
  auVar118 = psubusb(auVar404,auVar428);
  auVar154 = psubusb(auVar428,auVar404);
  auVar154 = auVar154 | auVar118;
  auVar118 = psubusb(auVar416,auVar428);
  auVar188 = psubusb(auVar428,auVar416);
  auVar188 = auVar188 | auVar118;
  bVar217 = auVar154[0];
  bVar220 = auVar188[0];
  bVar220 = (bVar220 < bVar217) * bVar217 | (bVar220 >= bVar217) * bVar220;
  bVar217 = auVar154[1];
  bVar223 = auVar188[1];
  bVar223 = (bVar223 < bVar217) * bVar217 | (bVar223 >= bVar217) * bVar223;
  bVar217 = auVar154[2];
  bVar227 = auVar188[2];
  bVar227 = (bVar227 < bVar217) * bVar217 | (bVar227 >= bVar217) * bVar227;
  bVar217 = auVar154[3];
  bVar112 = auVar188[3];
  bVar112 = (bVar112 < bVar217) * bVar217 | (bVar112 >= bVar217) * bVar112;
  bVar217 = auVar154[4];
  bVar123 = auVar188[4];
  bVar123 = (bVar123 < bVar217) * bVar217 | (bVar123 >= bVar217) * bVar123;
  bVar217 = auVar154[5];
  bVar126 = auVar188[5];
  bVar126 = (bVar126 < bVar217) * bVar217 | (bVar126 >= bVar217) * bVar126;
  bVar217 = auVar154[6];
  bVar129 = auVar188[6];
  bVar129 = (bVar129 < bVar217) * bVar217 | (bVar129 >= bVar217) * bVar129;
  bVar217 = auVar154[7];
  bVar175 = auVar188[7];
  bVar175 = (bVar175 < bVar217) * bVar217 | (bVar175 >= bVar217) * bVar175;
  auVar251._0_8_ = CONCAT44(uVar244,auVar69._0_4_);
  auVar251._8_4_ = uVar173;
  auVar261._12_4_ = auVar237._12_4_;
  auVar261._0_12_ = auVar251;
  bVar217 = (bVar220 < bVar208) * bVar208 | (bVar220 >= bVar208) * bVar220;
  bVar220 = (bVar223 < bVar211) * bVar211 | (bVar223 >= bVar211) * bVar223;
  bVar223 = (bVar227 < bVar213) * bVar213 | (bVar227 >= bVar213) * bVar227;
  bVar227 = (bVar112 < bVar215) * bVar215 | (bVar112 >= bVar215) * bVar112;
  bVar112 = (bVar123 < bVar430) * bVar430 | (bVar123 >= bVar430) * bVar123;
  bVar123 = (bVar126 < bVar124) * bVar124 | (bVar126 >= bVar124) * bVar126;
  bVar126 = (bVar129 < bVar127) * bVar127 | (bVar129 >= bVar127) * bVar129;
  bVar129 = (bVar175 < bVar130) * bVar130 | (bVar175 >= bVar130) * bVar175;
  bVar217 = (bVar112 < bVar217) * bVar217 | (bVar112 >= bVar217) * bVar112;
  bVar220 = (bVar123 < bVar220) * bVar220 | (bVar123 >= bVar220) * bVar123;
  bVar223 = (bVar126 < bVar223) * bVar223 | (bVar126 >= bVar223) * bVar126;
  bVar227 = (bVar129 < bVar227) * bVar227 | (bVar129 >= bVar227) * bVar129;
  auVar343._4_8_ = 0;
  auVar343._0_4_ = auVar436._12_4_;
  auVar343._12_4_ = uVar241;
  auVar342._8_8_ = auVar343._8_8_;
  auVar342._0_8_ = CONCAT44(uVar230,auVar436._12_4_);
  auVar403 = auVar342._0_14_;
  auVar379 = SUB1614(auVar391 ^ _DAT_004d2840,0);
  uVar113 = CONCAT13(-((byte)((bVar227 == 0) * bVar227 | bVar227 != 0) == bVar227),
                     CONCAT12(-((byte)((bVar223 == 0) * bVar223 | bVar223 != 0) == bVar223),
                              CONCAT11(-((byte)((bVar220 == 0) * bVar220 | bVar220 != 0) == bVar220)
                                       ,-((byte)((bVar217 == 0) * bVar217 | bVar217 != 0) == bVar217
                                         )))) & auVar369._0_4_;
  auVar336._4_4_ = uVar113;
  auVar336._0_4_ = uVar113;
  auVar336._8_4_ = uVar113;
  auVar336._12_4_ = uVar113;
  cVar125 = (char)uVar113;
  auVar121[0] = -(cVar125 == '\0');
  cVar128 = (char)(uVar113 >> 8);
  auVar121[1] = -(cVar128 == '\0');
  cVar131 = (char)(uVar113 >> 0x10);
  auVar121[2] = -(cVar131 == '\0');
  cVar133 = (char)(uVar113 >> 0x18);
  auVar121[3] = -(cVar133 == '\0');
  auVar121[4] = -(cVar125 == '\0');
  auVar121[5] = -(cVar128 == '\0');
  auVar121[6] = -(cVar131 == '\0');
  auVar121[7] = -(cVar133 == '\0');
  auVar121[8] = -(cVar125 == '\0');
  auVar121[9] = -(cVar128 == '\0');
  auVar121[10] = -(cVar131 == '\0');
  auVar121[0xb] = -(cVar133 == '\0');
  auVar121[0xc] = -(cVar125 == '\0');
  auVar121[0xd] = -(cVar128 == '\0');
  auVar121[0xe] = -(cVar131 == '\0');
  auVar121[0xf] = -(cVar133 == '\0');
  uVar281 = SUB168(auVar391 ^ _DAT_004d2840,8);
  auVar114._8_6_ = 0;
  auVar114._0_8_ = uVar281;
  if ((ushort)((ushort)(SUB161(auVar121 >> 7,0) & 1) | (ushort)(SUB161(auVar121 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar121 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar121 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar121 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar121 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar121 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar121 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar121 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar121 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar121 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar121 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar121 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar121 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar121 >> 0x77,0) & 1) << 0xe | (ushort)(auVar121[0xf] >> 7) << 0xf
              ) == 0xffff) {
    auVar63._4_4_ = uVar241;
    auVar63._0_4_ = uVar173;
    auVar63._8_4_ = auVar436._12_4_;
    auVar63._12_4_ = uVar244;
    auVar235 = auVar63._0_14_;
  }
  else {
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar428._0_13_;
    auVar5[0xe] = puVar2[8];
    uVar142 = auVar5._13_2_;
    auVar11[0xc] = auVar265[8];
    auVar11._0_12_ = auVar428._0_12_;
    auVar11._13_2_ = uVar142;
    auVar18[0xb] = 0;
    auVar18._0_11_ = auVar428._0_11_;
    auVar18._12_3_ = auVar11._12_3_;
    auVar25[10] = puVar1[8];
    auVar25._0_10_ = auVar428._0_10_;
    auVar25._11_4_ = auVar18._11_4_;
    auVar32[9] = 0;
    auVar32._0_9_ = auVar428._0_9_;
    auVar32._10_5_ = auVar25._10_5_;
    auVar39[8] = auVar122[8];
    auVar39._0_8_ = auVar428._0_8_;
    auVar39._9_6_ = auVar32._9_6_;
    auVar70._7_8_ = 0;
    auVar70._0_7_ = auVar39._8_7_;
    Var71 = CONCAT81(SUB158(auVar70 << 0x40,7),puVar2[7]);
    auVar100._9_6_ = 0;
    auVar100._0_9_ = Var71;
    auVar47[4] = auVar265[7];
    auVar47._0_4_ = uVar276;
    auVar47._5_10_ = SUB1510(auVar100 << 0x30,5);
    auVar72._11_4_ = 0;
    auVar72._0_11_ = auVar47._4_11_;
    auVar51[2] = puVar1[7];
    auVar51._0_2_ = auVar257._14_2_;
    auVar51._3_12_ = SUB1512(auVar72 << 0x20,3);
    uVar141 = auVar257._14_2_ & 0xff;
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar187._0_13_;
    auVar6[0xe] = puVar2[9];
    uVar358 = auVar6._13_2_;
    auVar12[0xc] = auVar265[9];
    auVar12._0_12_ = auVar177;
    auVar12._13_2_ = uVar358;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar177._0_11_;
    auVar19._12_3_ = auVar12._12_3_;
    auVar26[10] = puVar1[9];
    auVar26._0_10_ = auVar177._0_10_;
    auVar26._11_4_ = auVar19._11_4_;
    auVar33[9] = 0;
    auVar33._0_9_ = auVar177._0_9_;
    auVar33._10_5_ = auVar26._10_5_;
    auVar40[8] = auVar122[9];
    auVar40._0_8_ = auVar177._0_8_;
    auVar40._9_6_ = auVar33._9_6_;
    auVar73._7_8_ = 0;
    auVar73._0_7_ = auVar40._8_7_;
    Var74 = CONCAT81(SUB158(auVar73 << 0x40,7),puVar2[6]);
    auVar101._9_6_ = 0;
    auVar101._0_9_ = Var74;
    auVar75._1_10_ = SUB1510(auVar101 << 0x30,5);
    auVar75[0] = auVar265[6];
    auVar102._11_4_ = 0;
    auVar102._0_11_ = auVar75;
    auVar52[2] = puVar1[6];
    auVar52._0_2_ = uVar356;
    auVar52._3_12_ = SUB1512(auVar102 << 0x20,3);
    uVar356 = uVar356 & 0xff;
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar404._0_13_;
    auVar7[0xe] = puVar2[10];
    uVar225 = auVar7._13_2_;
    auVar13[0xc] = auVar265[10];
    auVar13._0_12_ = auVar401;
    auVar13._13_2_ = uVar225;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar401._0_11_;
    auVar20._12_3_ = auVar13._12_3_;
    auVar27[10] = puVar1[10];
    auVar27._0_10_ = auVar401._0_10_;
    auVar27._11_4_ = auVar20._11_4_;
    auVar34[9] = 0;
    auVar34._0_9_ = auVar401._0_9_;
    auVar34._10_5_ = auVar27._10_5_;
    auVar41[8] = auVar122[10];
    auVar41._0_8_ = auVar401._0_8_;
    auVar41._9_6_ = auVar34._9_6_;
    auVar76._7_8_ = 0;
    auVar76._0_7_ = auVar41._8_7_;
    Var77 = CONCAT81(SUB158(auVar76 << 0x40,7),puVar2[5]);
    auVar103._9_6_ = 0;
    auVar103._0_9_ = Var77;
    auVar48[4] = auVar265[5];
    auVar48._0_4_ = uVar271;
    auVar48._5_10_ = SUB1510(auVar103 << 0x30,5);
    auVar78._11_4_ = 0;
    auVar78._0_11_ = auVar48._4_11_;
    auVar53[2] = puVar1[5];
    auVar53._0_2_ = uVar201;
    auVar53._3_12_ = SUB1512(auVar78 << 0x20,3);
    uVar201 = uVar201 & 0xff;
    auVar8._12_2_ = 0;
    auVar8._0_12_ = auVar4;
    auVar8[0xe] = puVar2[0xb];
    uVar377 = auVar8._13_2_;
    auVar14[0xc] = auVar265[0xb];
    auVar14._0_12_ = auVar4;
    auVar14._13_2_ = uVar377;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar4._0_11_;
    auVar21._12_3_ = auVar14._12_3_;
    auVar28[10] = puVar1[0xb];
    auVar28._0_10_ = auVar4._0_10_;
    auVar28._11_4_ = auVar21._11_4_;
    auVar35[9] = 0;
    auVar35._0_9_ = auVar4._0_9_;
    auVar35._10_5_ = auVar28._10_5_;
    auVar42[8] = auVar122[0xb];
    auVar42._0_8_ = uVar145;
    auVar42._9_6_ = auVar35._9_6_;
    auVar79._7_8_ = 0;
    auVar79._0_7_ = auVar42._8_7_;
    Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),puVar2[4]);
    auVar104._9_6_ = 0;
    auVar104._0_9_ = Var80;
    auVar49[4] = auVar265[4];
    auVar49._0_4_ = uVar249;
    auVar49._5_10_ = SUB1510(auVar104 << 0x30,5);
    auVar81._11_4_ = 0;
    auVar81._0_11_ = auVar49._4_11_;
    auVar54[2] = puVar1[4];
    auVar54._0_2_ = uVar176;
    auVar54._3_12_ = SUB1512(auVar81 << 0x20,3);
    uVar176 = uVar176 & 0xff;
    sVar239 = auVar52._2_2_;
    sVar300 = auVar53._2_2_;
    sVar240 = auVar75._0_2_;
    sVar305 = auVar48._4_2_;
    sVar242 = (short)Var74;
    sVar309 = (short)Var77;
    sVar243 = auVar40._8_2_;
    sVar314 = auVar41._8_2_;
    sVar245 = auVar26._10_2_;
    sVar320 = auVar27._10_2_;
    sVar246 = auVar12._12_2_;
    sVar326 = auVar13._12_2_;
    sVar331 = (uVar225 >> 8) + (uVar358 >> 8);
    sVar279 = uVar201 + uVar356 + uVar141;
    sVar360 = auVar51._2_2_;
    sVar301 = sVar300 + sVar239 + sVar360;
    sVar361 = auVar47._4_2_;
    sVar306 = sVar305 + sVar240 + sVar361;
    sVar362 = (short)Var71;
    sVar310 = sVar309 + sVar242 + sVar362;
    sVar363 = auVar39._8_2_;
    sVar315 = sVar314 + sVar243 + sVar363;
    sVar364 = auVar25._10_2_;
    sVar321 = sVar320 + sVar245 + sVar364;
    sVar365 = auVar11._12_2_;
    sVar327 = sVar326 + sVar246 + sVar365;
    sVar332 = sVar331 + (uVar142 >> 8);
    sVar414 = sVar315 + sVar279 + 4;
    sVar417 = sVar321 + sVar301 + 4;
    sVar419 = sVar327 + sVar306 + 4;
    sVar421 = sVar332 + sVar310 + 4;
    auVar179 = auVar336._0_14_;
    sVar302 = auVar54._2_2_;
    sVar307 = auVar49._4_2_;
    sVar311 = (short)Var80;
    sVar316 = auVar42._8_2_;
    sVar322 = auVar28._10_2_;
    sVar328 = auVar14._12_2_;
    auVar110._8_6_ = 0;
    auVar110._0_8_ = uVar281;
    sVar422 = sVar421 - (uVar225 >> 8);
    auVar118 = psubusb(auVar342,auVar428);
    auVar154 = psubusb(auVar428,auVar342);
    auVar154 = auVar154 | auVar118;
    auVar61._8_4_ = auVar436._12_4_;
    auVar61._0_8_ = CONCAT44(uVar241,uVar173);
    auVar60._12_4_ = uVar244;
    auVar60._0_12_ = auVar61;
    auVar235 = auVar60._0_14_;
    auVar118 = psubusb(auVar60,auVar428);
    auVar188 = psubusb(auVar428,auVar60);
    auVar188 = auVar188 | auVar118;
    bVar217 = auVar154[0];
    bVar220 = auVar188[0];
    bVar220 = (bVar220 < bVar217) * bVar217 | (bVar220 >= bVar217) * bVar220;
    bVar217 = auVar154[1];
    bVar223 = auVar188[1];
    bVar223 = (bVar223 < bVar217) * bVar217 | (bVar223 >= bVar217) * bVar223;
    bVar217 = auVar154[2];
    bVar227 = auVar188[2];
    bVar227 = (bVar227 < bVar217) * bVar217 | (bVar227 >= bVar217) * bVar227;
    bVar217 = auVar154[3];
    bVar112 = auVar188[3];
    bVar112 = (bVar112 < bVar217) * bVar217 | (bVar112 >= bVar217) * bVar112;
    bVar217 = auVar154[4];
    bVar123 = auVar188[4];
    bVar123 = (bVar123 < bVar217) * bVar217 | (bVar123 >= bVar217) * bVar123;
    bVar217 = auVar154[5];
    bVar126 = auVar188[5];
    bVar126 = (bVar126 < bVar217) * bVar217 | (bVar126 >= bVar217) * bVar126;
    bVar217 = auVar154[6];
    bVar129 = auVar188[6];
    bVar129 = (bVar129 < bVar217) * bVar217 | (bVar129 >= bVar217) * bVar129;
    bVar217 = auVar154[7];
    bVar208 = auVar188[7];
    bVar208 = (bVar208 < bVar217) * bVar217 | (bVar208 >= bVar217) * bVar208;
    bVar217 = auVar154[8];
    bVar175 = auVar188[8];
    bVar175 = (bVar175 < bVar217) * bVar217 | (bVar175 >= bVar217) * bVar175;
    bVar217 = auVar154[9];
    bVar211 = auVar188[9];
    bVar211 = (bVar211 < bVar217) * bVar217 | (bVar211 >= bVar217) * bVar211;
    bVar217 = auVar154[10];
    bVar213 = auVar188[10];
    bVar213 = (bVar213 < bVar217) * bVar217 | (bVar213 >= bVar217) * bVar213;
    bVar217 = auVar154[0xb];
    bVar215 = auVar188[0xb];
    bVar215 = (bVar215 < bVar217) * bVar217 | (bVar215 >= bVar217) * bVar215;
    bVar217 = auVar154[0xc];
    bVar218 = auVar188[0xc];
    bVar218 = (bVar218 < bVar217) * bVar217 | (bVar218 >= bVar217) * bVar218;
    bVar217 = auVar154[0xd];
    bVar221 = auVar188[0xd];
    bVar221 = (bVar221 < bVar217) * bVar217 | (bVar221 >= bVar217) * bVar221;
    bVar217 = auVar154[0xe];
    bVar224 = auVar188[0xe];
    bVar228 = auVar188[0xf];
    bVar224 = (bVar224 < bVar217) * bVar217 | (bVar224 >= bVar217) * bVar224;
    bVar217 = auVar154[0xf];
    bVar228 = (bVar228 < bVar217) * bVar217 | (bVar228 >= bVar217) * bVar228;
    auVar118 = psubusb(auVar261,auVar428);
    auVar154 = psubusb(auVar428,auVar261);
    auVar154 = auVar154 | auVar118;
    bVar217 = auVar154[0];
    bVar174 = (bVar217 < bVar220) * bVar220 | (bVar217 >= bVar220) * bVar217;
    bVar217 = auVar154[1];
    bVar199 = (bVar217 < bVar223) * bVar223 | (bVar217 >= bVar223) * bVar217;
    bVar217 = auVar154[2];
    bVar200 = (bVar217 < bVar227) * bVar227 | (bVar217 >= bVar227) * bVar217;
    bVar217 = auVar154[3];
    bVar202 = (bVar217 < bVar112) * bVar112 | (bVar217 >= bVar112) * bVar217;
    bVar217 = auVar154[4];
    bVar203 = (bVar217 < bVar123) * bVar123 | (bVar217 >= bVar123) * bVar217;
    bVar217 = auVar154[5];
    bVar205 = (bVar217 < bVar126) * bVar126 | (bVar217 >= bVar126) * bVar217;
    bVar217 = auVar154[6];
    bVar206 = (bVar217 < bVar129) * bVar129 | (bVar217 >= bVar129) * bVar217;
    bVar217 = auVar154[7];
    bVar207 = (bVar217 < bVar208) * bVar208 | (bVar217 >= bVar208) * bVar217;
    bVar217 = auVar154[8];
    bVar209 = (bVar217 < bVar175) * bVar175 | (bVar217 >= bVar175) * bVar217;
    bVar217 = auVar154[9];
    bVar210 = (bVar217 < bVar211) * bVar211 | (bVar217 >= bVar211) * bVar217;
    bVar217 = auVar154[10];
    bVar212 = (bVar217 < bVar213) * bVar213 | (bVar217 >= bVar213) * bVar217;
    bVar217 = auVar154[0xb];
    bVar430 = (bVar217 < bVar215) * bVar215 | (bVar217 >= bVar215) * bVar217;
    bVar217 = auVar154[0xc];
    bVar220 = (bVar217 < bVar218) * bVar218 | (bVar217 >= bVar218) * bVar217;
    bVar217 = auVar154[0xd];
    bVar223 = (bVar217 < bVar221) * bVar221 | (bVar217 >= bVar221) * bVar217;
    bVar217 = auVar154[0xe];
    bVar227 = auVar154[0xf];
    bVar217 = (bVar217 < bVar224) * bVar224 | (bVar217 >= bVar224) * bVar217;
    bVar227 = (bVar227 < bVar228) * bVar228 | (bVar227 >= bVar228) * bVar227;
    bVar112 = (bVar203 < bVar174) * bVar174 | (bVar203 >= bVar174) * bVar203;
    bVar123 = (bVar205 < bVar199) * bVar199 | (bVar205 >= bVar199) * bVar205;
    bVar126 = (bVar206 < bVar200) * bVar200 | (bVar206 >= bVar200) * bVar206;
    bVar129 = (bVar207 < bVar202) * bVar202 | (bVar207 >= bVar202) * bVar207;
    bVar208 = (bVar209 < bVar203) * bVar203 | (bVar209 >= bVar203) * bVar209;
    bVar175 = (bVar210 < bVar205) * bVar205 | (bVar210 >= bVar205) * bVar210;
    bVar211 = (bVar212 < bVar206) * bVar206 | (bVar212 >= bVar206) * bVar212;
    bVar213 = (bVar430 < bVar207) * bVar207 | (bVar430 >= bVar207) * bVar430;
    bVar215 = (bVar220 < bVar209) * bVar209 | (bVar220 >= bVar209) * bVar220;
    bVar218 = (bVar223 < bVar210) * bVar210 | (bVar223 >= bVar210) * bVar223;
    bVar221 = (bVar217 < bVar212) * bVar212 | (bVar217 >= bVar212) * bVar217;
    bVar224 = (bVar227 < bVar430) * bVar430 | (bVar227 >= bVar430) * bVar227;
    bVar220 = (bVar220 != 0) * bVar220;
    bVar223 = (bVar223 != 0) * bVar223;
    bVar217 = (bVar217 != 0) * bVar217;
    bVar227 = (bVar227 != 0) * bVar227;
    auVar149[0] = -((byte)((bVar112 == 0) * bVar112 | bVar112 != 0) == bVar112);
    auVar149[1] = -((byte)((bVar123 == 0) * bVar123 | bVar123 != 0) == bVar123);
    auVar149[2] = -((byte)((bVar126 == 0) * bVar126 | bVar126 != 0) == bVar126);
    auVar149[3] = -((byte)((bVar129 == 0) * bVar129 | bVar129 != 0) == bVar129);
    auVar149[4] = -((byte)((bVar208 == 0) * bVar208 | bVar208 != 0) == bVar208);
    auVar149[5] = -((byte)((bVar175 == 0) * bVar175 | bVar175 != 0) == bVar175);
    auVar149[6] = -((byte)((bVar211 == 0) * bVar211 | bVar211 != 0) == bVar211);
    auVar149[7] = -((byte)((bVar213 == 0) * bVar213 | bVar213 != 0) == bVar213);
    auVar149[8] = -((byte)((bVar215 == 0) * bVar215 | bVar215 != 0) == bVar215);
    auVar149[9] = -((byte)((bVar218 == 0) * bVar218 | bVar218 != 0) == bVar218);
    auVar149[10] = -((byte)((bVar221 == 0) * bVar221 | bVar221 != 0) == bVar221);
    auVar149[0xb] = -((byte)((bVar224 == 0) * bVar224 | bVar224 != 0) == bVar224);
    auVar149[0xc] = -((byte)((bVar220 == 0) * bVar220 | bVar220 != 0) == bVar220);
    auVar149[0xd] = -((byte)((bVar223 == 0) * bVar223 | bVar223 != 0) == bVar223);
    auVar149[0xe] = -((byte)((bVar217 == 0) * bVar217 | bVar217 != 0) == bVar217);
    auVar149[0xf] = -((byte)((bVar227 == 0) * bVar227 | bVar227 != 0) == bVar227);
    uVar280 = (ushort)(uVar176 + uVar141 + sVar414) >> 3;
    uVar303 = (ushort)(sVar302 + sVar360 + sVar417) >> 3;
    uVar308 = (ushort)(sVar307 + sVar361 + sVar419) >> 3;
    uVar312 = (ushort)(sVar311 + sVar362 + sVar421) >> 3;
    uVar317 = (ushort)(sVar316 + sVar363 + sVar414) >> 3;
    uVar323 = (ushort)(sVar322 + sVar364 + sVar417) >> 3;
    uVar329 = (ushort)(sVar328 + sVar365 + sVar419) >> 3;
    uVar333 = (ushort)((uVar377 >> 8) + (uVar142 >> 8) + sVar421) >> 3;
    auVar282[1] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
    auVar282[0] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar282[2] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar282[3] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar282[4] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    auVar282[5] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar282[6] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
    auVar282[7] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
    auVar282[8] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar282[9] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
    auVar282[10] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar282[0xb] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar282[0xc] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    auVar282[0xd] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar379 = auVar282 & auVar179 | ~auVar179 & auVar379;
    uVar280 = (ushort)((sVar414 - sVar314) + uVar176 * 2 + uVar356) >> 3;
    uVar303 = (ushort)((sVar417 - sVar320) + sVar302 * 2 + sVar239) >> 3;
    uVar308 = (ushort)((sVar419 - sVar326) + sVar307 * 2 + sVar240) >> 3;
    uVar312 = (ushort)(sVar422 + sVar311 * 2 + sVar242) >> 3;
    uVar317 = (ushort)((sVar414 - uVar201) + sVar316 * 2 + sVar243) >> 3;
    uVar323 = (ushort)((sVar417 - sVar300) + sVar322 * 2 + sVar245) >> 3;
    uVar329 = (ushort)((sVar419 - sVar305) + sVar328 * 2 + sVar246) >> 3;
    uVar333 = (ushort)((sVar421 - sVar309) + (uVar377 >> 8) * 2 + (uVar358 >> 8)) >> 3;
    auVar415[1] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
    auVar415[0] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar415[2] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar415[3] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar415[4] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    auVar415[5] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar415[6] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
    auVar415[7] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
    auVar415[8] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar415[9] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
    auVar415[10] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar415[0xb] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar415[0xc] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    auVar415[0xd] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar114 = auVar415 & auVar179 | ~auVar179 & auVar110;
    uVar280 = (ushort)(((uVar176 * 3 + uVar201) - sVar243) + (sVar414 - sVar314)) >> 3;
    uVar303 = (ushort)(((sVar302 * 3 + sVar300) - sVar245) + (sVar417 - sVar320)) >> 3;
    uVar308 = (ushort)(((sVar307 * 3 + sVar305) - sVar246) + (sVar419 - sVar326)) >> 3;
    uVar312 = (ushort)(((sVar311 * 3 + sVar309) - (uVar358 >> 8)) + sVar422) >> 3;
    uVar317 = (ushort)(((sVar316 * 3 + sVar314) - uVar356) + (sVar414 - uVar201)) >> 3;
    uVar323 = (ushort)(((sVar322 * 3 + sVar320) - sVar239) + (sVar417 - sVar300)) >> 3;
    uVar329 = (ushort)(((sVar328 * 3 + sVar326) - sVar240) + (sVar419 - sVar305)) >> 3;
    uVar333 = (ushort)((((uVar377 >> 8) * 3 + (uVar225 >> 8)) - sVar242) + (sVar421 - sVar309)) >> 3
    ;
    auVar366[1] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
    auVar366[0] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar366[2] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar366[3] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar366[4] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    auVar366[5] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar366[6] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
    auVar366[7] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
    auVar366[8] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar366[9] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
    auVar366[10] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar366[0xb] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar366[0xc] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    auVar366[0xd] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar149 = auVar149 & auVar336;
    auVar367 = auVar366 & auVar179 | ~auVar179 & auVar367;
    auVar238._4_4_ = auVar149._0_4_;
    auVar238._0_4_ = auVar149._0_4_;
    auVar238._8_4_ = auVar149._4_4_;
    auVar238._12_4_ = auVar149._4_4_;
    auVar150[0] = -(auVar149[0] == '\0');
    auVar150[1] = -(auVar149[1] == '\0');
    auVar150[2] = -(auVar149[2] == '\0');
    auVar150[3] = -(auVar149[3] == '\0');
    auVar150[4] = -(auVar149[0] == '\0');
    auVar150[5] = -(auVar149[1] == '\0');
    auVar150[6] = -(auVar149[2] == '\0');
    auVar150[7] = -(auVar149[3] == '\0');
    auVar150[8] = -(auVar149[4] == '\0');
    auVar150[9] = -(auVar149[5] == '\0');
    auVar150[10] = -(auVar149[6] == '\0');
    auVar150[0xb] = -(auVar149[7] == '\0');
    auVar150[0xc] = -(auVar149[4] == '\0');
    auVar150[0xd] = -(auVar149[5] == '\0');
    auVar150[0xe] = -(auVar149[6] == '\0');
    auVar150[0xf] = -(auVar149[7] == '\0');
    if ((ushort)((ushort)(SUB161(auVar150 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar150 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar150 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar150 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar150 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar150 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar150 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar150 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar150 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar150 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar150 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar150 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar150 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar150 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar150 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar150[0xf] >> 7) << 0xf) == 0xffff) {
      auVar179._12_2_ = 0;
    }
    else {
      auVar15[0xd] = 0;
      auVar15._0_13_ = auVar261._0_13_;
      auVar15[0xe] = uVar59;
      auVar22[0xc] = uVar153;
      auVar22._0_12_ = auVar251;
      auVar22._13_2_ = auVar15._13_2_;
      auVar29[0xb] = 0;
      auVar29._0_11_ = auVar251._0_11_;
      auVar29._12_3_ = auVar22._12_3_;
      auVar36[10] = uVar57;
      auVar36._0_10_ = auVar251._0_10_;
      auVar36._11_4_ = auVar29._11_4_;
      auVar43[9] = 0;
      auVar43._0_9_ = auVar251._0_9_;
      auVar43._10_5_ = auVar36._10_5_;
      auVar46[8] = uVar247;
      auVar46._0_8_ = auVar251._0_8_;
      auVar46._9_6_ = auVar43._9_6_;
      auVar82._7_8_ = 0;
      auVar82._0_7_ = auVar46._8_7_;
      Var71 = CONCAT81(SUB158(auVar82 << 0x40,7),uVar58);
      auVar105._9_6_ = 0;
      auVar105._0_9_ = Var71;
      auVar83._1_10_ = SUB1510(auVar105 << 0x30,5);
      auVar83[0] = uVar198;
      auVar106._11_4_ = 0;
      auVar106._0_11_ = auVar83;
      auVar84._1_12_ = SUB1512(auVar106 << 0x20,3);
      auVar84[0] = uVar56;
      auVar151._0_2_ = auVar64._0_2_ & 0xff;
      auVar151._2_13_ = auVar84;
      auVar151[0xf] = 0;
      auVar64 = auVar238._0_14_;
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar342._0_13_;
      auVar9[0xe] = puVar2[0xc];
      uVar280 = auVar9._13_2_;
      auVar16[0xc] = auVar265[0xc];
      auVar16._0_12_ = auVar342._0_12_;
      auVar16._13_2_ = uVar280;
      auVar23[0xb] = 0;
      auVar23._0_11_ = auVar342._0_11_;
      auVar23._12_3_ = auVar16._12_3_;
      auVar30[10] = puVar1[0xc];
      auVar30._0_10_ = auVar342._0_10_;
      auVar30._11_4_ = auVar23._11_4_;
      auVar37[9] = 0;
      auVar37._0_9_ = auVar342._0_9_;
      auVar37._10_5_ = auVar30._10_5_;
      auVar44[8] = auVar122[0xc];
      auVar44._0_8_ = auVar342._0_8_;
      auVar44._9_6_ = auVar37._9_6_;
      auVar85._7_8_ = 0;
      auVar85._0_7_ = auVar44._8_7_;
      Var74 = CONCAT81(SUB158(auVar85 << 0x40,7),puVar2[3]);
      auVar107._9_6_ = 0;
      auVar107._0_9_ = Var74;
      auVar50[4] = auVar265[3];
      auVar50._0_4_ = auVar436._12_4_;
      auVar50._5_10_ = SUB1510(auVar107 << 0x30,5);
      auVar86._11_4_ = 0;
      auVar86._0_11_ = auVar50._4_11_;
      auVar55[2] = puVar1[3];
      auVar55._0_2_ = uVar338;
      auVar55._3_12_ = SUB1512(auVar86 << 0x20,3);
      uVar338 = uVar338 & 0xff;
      auVar10[0xd] = 0;
      auVar10._0_13_ = auVar60._0_13_;
      auVar10[0xe] = puVar2[0xd];
      uVar303 = auVar10._13_2_;
      auVar17[0xc] = auVar265[0xd];
      auVar17._0_12_ = auVar61;
      auVar17._13_2_ = uVar303;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar61._0_11_;
      auVar24._12_3_ = auVar17._12_3_;
      auVar31[10] = puVar1[0xd];
      auVar31._0_10_ = auVar61._0_10_;
      auVar31._11_4_ = auVar24._11_4_;
      auVar38[9] = 0;
      auVar38._0_9_ = auVar61._0_9_;
      auVar38._10_5_ = auVar31._10_5_;
      auVar45[8] = auVar122[0xd];
      auVar45._0_8_ = CONCAT44(uVar241,uVar173);
      auVar45._9_6_ = auVar38._9_6_;
      auVar87._7_8_ = 0;
      auVar87._0_7_ = auVar45._8_7_;
      Var77 = CONCAT81(SUB158(auVar87 << 0x40,7),puVar2[2]);
      auVar108._9_6_ = 0;
      auVar108._0_9_ = Var77;
      auVar88._1_10_ = SUB1510(auVar108 << 0x30,5);
      auVar88[0] = auVar265[2];
      auVar109._11_4_ = 0;
      auVar109._0_11_ = auVar88;
      auVar89._1_12_ = SUB1512(auVar109 << 0x20,3);
      auVar89[0] = puVar1[2];
      uVar337 = auVar65._0_2_ & 0xff;
      sVar418 = auVar55._2_2_;
      sVar420 = auVar50._4_2_;
      sVar423 = (short)Var74;
      sVar424 = auVar44._8_2_;
      sVar425 = auVar30._10_2_;
      sVar426 = auVar16._12_2_;
      sVar427 = (uVar280 >> 8) + (uVar377 >> 8);
      sVar248 = uVar338 + uVar176 + uVar337;
      sVar352 = auVar89._0_2_;
      sVar269 = sVar418 + sVar302 + sVar352;
      sVar353 = auVar88._0_2_;
      sVar270 = sVar420 + sVar307 + sVar353;
      sVar354 = (short)Var77;
      sVar272 = sVar423 + sVar311 + sVar354;
      sVar355 = auVar45._8_2_;
      sVar273 = sVar424 + sVar316 + sVar355;
      sVar357 = auVar31._10_2_;
      sVar274 = sVar425 + sVar322 + sVar357;
      sVar359 = auVar17._12_2_;
      sVar275 = sVar426 + sVar328 + sVar359;
      sVar277 = sVar427 + (uVar303 >> 8);
      sVar414 = auVar84._0_2_;
      sVar417 = auVar83._0_2_;
      sVar419 = (short)Var71;
      sVar421 = auVar46._8_2_;
      sVar422 = auVar36._10_2_;
      sVar152 = auVar22._12_2_;
      uVar308 = auVar15._13_2_ >> 8;
      sVar279 = sVar315 + sVar273 + sVar279 + sVar248 + 8;
      sVar315 = sVar321 + sVar274 + sVar301 + sVar269 + 8;
      sVar405 = sVar327 + sVar275 + sVar306 + sVar270 + 8;
      sVar409 = sVar332 + sVar277 + sVar310 + sVar272 + 8;
      auVar118 = psllw(auVar151,2);
      sVar410 = sVar409 - (uVar303 >> 8);
      sVar431 = (sVar279 - uVar337) - uVar338;
      sVar438 = (sVar315 - sVar352) - sVar418;
      sVar441 = (sVar405 - sVar353) - sVar420;
      sVar444 = (sVar409 - sVar354) - sVar423;
      sVar301 = (sVar279 - sVar355) - sVar424;
      sVar321 = (sVar315 - sVar357) - sVar425;
      sVar406 = (sVar405 - sVar359) - sVar426;
      sVar411 = sVar410 - (uVar280 >> 8);
      sVar306 = sVar301 - sVar316;
      sVar327 = sVar321 - sVar322;
      sVar407 = sVar406 - sVar328;
      sVar412 = sVar411 - (uVar377 >> 8);
      sVar432 = sVar431 - uVar176;
      sVar439 = sVar438 - sVar302;
      sVar442 = sVar441 - sVar307;
      sVar445 = sVar444 - sVar311;
      auVar235._12_2_ = 0;
      auVar235._0_12_ = auVar4;
      sVar310 = sVar306 - sVar314;
      sVar332 = sVar327 - sVar320;
      sVar408 = sVar407 - sVar326;
      sVar413 = sVar412 - (uVar225 >> 8);
      sVar433 = sVar432 - uVar201;
      sVar440 = sVar439 - sVar300;
      sVar443 = sVar442 - sVar305;
      sVar446 = sVar445 - sVar309;
      uVar312 = (ushort)(sVar363 + auVar151._0_2_ + uVar141 + uVar356 + sVar279) >> 4;
      uVar317 = (ushort)(sVar364 + sVar414 + sVar360 + sVar239 + sVar315) >> 4;
      uVar323 = (ushort)(sVar365 + sVar417 + sVar361 + sVar240 + sVar405) >> 4;
      uVar329 = (ushort)((uVar142 >> 8) + sVar419 + sVar362 + sVar242 + sVar409) >> 4;
      uVar333 = (ushort)(sVar421 + sVar363 + sVar243 + uVar141 + sVar279) >> 4;
      uVar324 = (ushort)(sVar422 + sVar364 + sVar245 + sVar360 + sVar315) >> 4;
      uVar330 = (ushort)(sVar152 + sVar365 + sVar246 + sVar361 + sVar405) >> 4;
      uVar334 = (ushort)(uVar308 + (uVar142 >> 8) + (uVar358 >> 8) + sVar362 + sVar409) >> 4;
      auVar283[1] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar283[0] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar283[2] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar283[3] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
      auVar283[4] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
      auVar283[5] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
      auVar283[6] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
      auVar283[7] = (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334);
      auVar283[8] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar283[9] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar283[10] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar283[0xb] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
      auVar283[0xc] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
      auVar283[0xd] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
      auVar379 = auVar283 & auVar64 | ~auVar64 & auVar379;
      uVar312 = (ushort)((sVar279 - sVar355) + uVar356 + uVar141 + uVar201 + auVar151._0_2_ * 2) >>
                4;
      uVar317 = (ushort)((sVar315 - sVar357) + sVar239 + sVar360 + sVar300 + sVar414 * 2) >> 4;
      uVar323 = (ushort)((sVar405 - sVar359) + sVar240 + sVar361 + sVar305 + sVar417 * 2) >> 4;
      uVar329 = (ushort)(sVar410 + sVar242 + sVar362 + sVar309 + sVar419 * 2) >> 4;
      uVar333 = (ushort)((sVar279 - uVar337) + sVar243 + sVar363 + sVar314 + sVar421 * 2) >> 4;
      uVar141 = (ushort)((sVar315 - sVar352) + sVar245 + sVar364 + sVar320 + sVar422 * 2) >> 4;
      uVar324 = (ushort)((sVar405 - sVar353) + sVar246 + sVar365 + sVar326 + sVar152 * 2) >> 4;
      uVar142 = (ushort)((sVar409 - sVar354) +
                        (uVar358 >> 8) + (uVar142 >> 8) + (uVar225 >> 8) + uVar308 * 2) >> 4;
      auVar115[1] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar115[0] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar115[2] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar115[3] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
      auVar115[4] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
      auVar115[5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 - (0xff < uVar141);
      auVar115[6] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
      auVar115[7] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar115[8] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar115[9] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar115[10] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar115[0xb] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
      auVar115[0xc] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
      auVar115[0xd] = (uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 - (0xff < uVar141);
      auVar114 = auVar115 & auVar64 | ~auVar64 & auVar114;
      uVar142 = (ushort)(sVar301 + uVar201 + uVar356 + uVar176 + auVar151._0_2_ * 3) >> 4;
      uVar312 = (ushort)(sVar321 + sVar300 + sVar239 + sVar302 + sVar414 * 3) >> 4;
      uVar317 = (ushort)(sVar406 + sVar305 + sVar240 + sVar307 + sVar417 * 3) >> 4;
      uVar323 = (ushort)(sVar411 + sVar309 + sVar242 + sVar311 + sVar419 * 3) >> 4;
      uVar329 = (ushort)(sVar431 + sVar314 + sVar243 + sVar316 + sVar421 * 3) >> 4;
      uVar333 = (ushort)(sVar438 + sVar320 + sVar245 + sVar322 + sVar422 * 3) >> 4;
      uVar141 = (ushort)(sVar441 + sVar326 + sVar246 + sVar328 + sVar152 * 3) >> 4;
      uVar377 = (ushort)(sVar444 + sVar331 + (uVar377 >> 8) + uVar308 * 3) >> 4;
      auVar368[1] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar368[0] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar368[2] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar368[3] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar368[4] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
      auVar368[5] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
      auVar368[6] = (uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 - (0xff < uVar141);
      auVar368[7] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar368[8] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar368[9] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar368[10] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar368[0xb] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar368[0xc] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
      auVar368[0xd] = (uVar333 != 0) * (uVar333 < 0x100) * (char)uVar333 - (0xff < uVar333);
      auVar367 = auVar368 & auVar64 | ~auVar64 & auVar367;
      uVar176 = (ushort)(sVar306 + uVar338 + uVar176 + uVar201 + auVar118._0_2_) >> 4;
      uVar201 = (ushort)(sVar327 + sVar418 + sVar302 + sVar300 + auVar118._2_2_) >> 4;
      uVar142 = (ushort)(sVar407 + sVar420 + sVar307 + sVar305 + auVar118._4_2_) >> 4;
      uVar377 = (ushort)(sVar412 + sVar423 + sVar311 + sVar309 + auVar118._6_2_) >> 4;
      uVar312 = (ushort)(sVar432 + sVar424 + sVar316 + sVar314 + auVar118._8_2_) >> 4;
      uVar317 = (ushort)(sVar439 + sVar425 + sVar322 + sVar320 + auVar118._10_2_) >> 4;
      uVar323 = (ushort)(sVar442 + sVar426 + sVar328 + sVar326 + auVar118._12_2_) >> 4;
      uVar225 = (ushort)(sVar445 + sVar427 + (uVar225 >> 8) + auVar118._14_2_) >> 4;
      auVar178[1] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar178[0] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176);
      auVar178[2] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar178[3] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar178[4] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar178[5] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar178[6] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar178[7] = (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225);
      auVar178[8] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176);
      auVar178[9] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar178[10] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar178[0xb] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar178[0xc] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar178[0xd] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar179 = auVar178 & auVar64 | ~auVar64 & auVar235;
      uVar176 = (ushort)(sVar310 + auVar118._0_2_ + auVar151._0_2_ + sVar248) >> 4;
      uVar201 = (ushort)(sVar332 + auVar118._2_2_ + sVar414 + sVar269) >> 4;
      uVar142 = (ushort)(sVar408 + auVar118._4_2_ + sVar417 + sVar270) >> 4;
      uVar225 = (ushort)(sVar413 + auVar118._6_2_ + sVar419 + sVar272) >> 4;
      uVar377 = (ushort)(sVar433 + auVar118._8_2_ + sVar421 + sVar273) >> 4;
      uVar312 = (ushort)(sVar440 + auVar118._10_2_ + sVar422 + sVar274) >> 4;
      uVar317 = (ushort)(sVar443 + auVar118._12_2_ + sVar152 + sVar275) >> 4;
      uVar323 = (ushort)(sVar446 + auVar118._14_2_ + uVar308 + sVar277) >> 4;
      auVar402[1] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar402[0] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176);
      auVar402[2] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar402[3] = (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225);
      auVar402[4] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar402[5] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar402[6] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar402[7] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar402[8] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176);
      auVar402[9] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar402[10] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar402[0xb] = (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225);
      auVar402[0xc] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar402[0xd] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar403 = auVar402 & auVar64 | ~auVar64 & auVar403;
      uVar338 = (ushort)(((uVar337 + uVar338 + auVar151._0_2_ * 7) - sVar243) + sVar310) >> 4;
      uVar176 = (ushort)(((sVar352 + sVar418 + sVar414 * 7) - sVar245) + sVar332) >> 4;
      uVar201 = (ushort)(((sVar353 + sVar420 + sVar417 * 7) - sVar246) + sVar408) >> 4;
      uVar142 = (ushort)(((sVar354 + sVar423 + sVar419 * 7) - (uVar358 >> 8)) + sVar413) >> 4;
      uVar356 = (ushort)(((sVar355 + sVar424 + sVar421 * 7) - uVar356) + sVar433) >> 4;
      uVar358 = (ushort)(((sVar357 + sVar425 + sVar422 * 7) - sVar239) + sVar440) >> 4;
      uVar225 = (ushort)(((sVar359 + sVar426 + sVar152 * 7) - sVar240) + sVar443) >> 4;
      uVar377 = (ushort)((((uVar303 >> 8) + (uVar280 >> 8) + uVar308 * 7) - sVar242) + sVar446) >> 4
      ;
      auVar340[1] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176);
      auVar340[0] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
      auVar340[2] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar340[3] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar340[4] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
      auVar340[5] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
      auVar340[6] = (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225);
      auVar340[7] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar340[8] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
      auVar340[9] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176);
      auVar340[10] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar340[0xb] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
      auVar340[0xc] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
      auVar340[0xd] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
      auVar62._4_4_ = uVar241;
      auVar62._0_4_ = uVar173;
      auVar62._8_4_ = auVar436._12_4_;
      auVar62._12_4_ = uVar244;
      auVar235 = ~auVar64 & auVar62._0_14_ | auVar340 & auVar64;
    }
  }
  auVar268._0_14_ = auVar261._0_14_;
  auVar293._0_14_ = auVar434._0_14_;
  auVar293[0xe] = uVar58;
  auVar293[0xf] = uVar59;
  auVar292._14_2_ = auVar293._14_2_;
  auVar292._0_13_ = auVar434._0_13_;
  auVar292[0xd] = uVar153;
  auVar291._13_3_ = auVar292._13_3_;
  auVar291._0_12_ = auVar434._0_12_;
  auVar291[0xc] = uVar198;
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._0_11_ = auVar434._0_11_;
  auVar290[0xb] = uVar57;
  auVar289._11_5_ = auVar290._11_5_;
  auVar289._0_10_ = auVar434._0_10_;
  auVar289[10] = uVar56;
  auVar288._10_6_ = auVar289._10_6_;
  auVar288._0_9_ = auVar434._0_9_;
  auVar288[9] = uVar247;
  auVar287._9_7_ = auVar288._9_7_;
  auVar287._0_8_ = auVar434._0_8_;
  auVar287[8] = auVar122[1];
  Var66 = CONCAT91(CONCAT81(auVar287._8_8_,uVar58),*puVar2);
  auVar91._2_10_ = Var66;
  auVar91[1] = uVar198;
  auVar91[0] = auVar265[0];
  auVar90._2_12_ = auVar91;
  auVar90[1] = uVar56;
  auVar90[0] = *puVar1;
  uVar448 = auVar122._0_2_;
  auVar286._2_14_ = auVar90;
  auVar161[0xe] = auVar235[7];
  auVar161._0_14_ = auVar235;
  auVar161[0xf] = auVar403[7];
  auVar160._14_2_ = auVar161._14_2_;
  auVar160._0_13_ = auVar235._0_13_;
  auVar160[0xd] = auVar403[6];
  auVar159._13_3_ = auVar160._13_3_;
  auVar159._0_12_ = auVar235._0_12_;
  auVar159[0xc] = auVar235[6];
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_11_ = auVar235._0_11_;
  auVar158[0xb] = auVar403[5];
  auVar157._11_5_ = auVar158._11_5_;
  auVar157._0_10_ = auVar235._0_10_;
  auVar157[10] = auVar235[5];
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_9_ = auVar235._0_9_;
  auVar156[9] = auVar403[4];
  auVar155._9_7_ = auVar156._9_7_;
  auVar155._0_8_ = auVar235._0_8_;
  auVar155[8] = auVar235[4];
  Var68 = CONCAT91(CONCAT81(auVar155._8_8_,auVar403[3]),auVar235[3]);
  auVar93._2_10_ = Var68;
  auVar93[1] = auVar403[2];
  auVar93[0] = auVar235[2];
  auVar92._2_12_ = auVar93;
  auVar92[1] = auVar403[1];
  auVar92[0] = auVar235[1];
  auVar297._0_12_ = auVar286._0_12_;
  auVar297._12_2_ = (short)Var66;
  auVar297._14_2_ = (short)Var68;
  auVar296._12_4_ = auVar297._12_4_;
  auVar296._0_10_ = auVar286._0_10_;
  auVar296._10_2_ = auVar93._0_2_;
  auVar295._10_6_ = auVar296._10_6_;
  auVar295._0_8_ = auVar286._0_8_;
  auVar295._8_2_ = auVar91._0_2_;
  auVar94._4_8_ = auVar295._8_8_;
  auVar94._2_2_ = auVar92._0_2_;
  auVar94._0_2_ = auVar90._0_2_;
  auVar294._0_4_ = CONCAT22(CONCAT11(auVar403[0],auVar235[0]),uVar448);
  auVar294._4_12_ = auVar94;
  auVar169[0xe] = auVar179[7];
  auVar169._0_14_ = auVar179;
  auVar169[0xf] = auVar367[7];
  auVar168._14_2_ = auVar169._14_2_;
  auVar168._0_13_ = auVar179._0_13_;
  auVar168[0xd] = auVar367[6];
  auVar167._13_3_ = auVar168._13_3_;
  auVar167._0_12_ = auVar179._0_12_;
  auVar167[0xc] = auVar179[6];
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._0_11_ = auVar179._0_11_;
  auVar166[0xb] = auVar367[5];
  auVar165._11_5_ = auVar166._11_5_;
  auVar165._0_10_ = auVar179._0_10_;
  auVar165[10] = auVar179[5];
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._0_9_ = auVar179._0_9_;
  auVar164[9] = auVar367[4];
  auVar163._9_7_ = auVar164._9_7_;
  auVar163._0_8_ = auVar179._0_8_;
  auVar163[8] = auVar179[4];
  Var66 = CONCAT91(CONCAT81(auVar163._8_8_,auVar367[3]),auVar179[3]);
  auVar96._2_10_ = Var66;
  auVar96[1] = auVar367[2];
  auVar96[0] = auVar179[2];
  auVar95._2_12_ = auVar96;
  auVar95[1] = auVar367[1];
  auVar95[0] = auVar179[1];
  uVar447 = CONCAT11(auVar367[0],auVar179[0]);
  auVar162._2_14_ = auVar95;
  auVar196[0xe] = auVar114[7];
  auVar196._0_14_ = auVar114;
  auVar196[0xf] = auVar379[7];
  auVar195._14_2_ = auVar196._14_2_;
  auVar195._0_13_ = auVar114._0_13_;
  auVar195[0xd] = auVar379[6];
  auVar194._13_3_ = auVar195._13_3_;
  auVar194._0_12_ = auVar114._0_12_;
  auVar194[0xc] = auVar114[6];
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._0_11_ = auVar114._0_11_;
  auVar193[0xb] = auVar379[5];
  auVar192._11_5_ = auVar193._11_5_;
  auVar192._0_10_ = auVar114._0_10_;
  auVar192[10] = auVar114[5];
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._0_9_ = auVar114._0_9_;
  auVar191[9] = auVar379[4];
  auVar190._9_7_ = auVar191._9_7_;
  auVar190._0_8_ = auVar114._0_8_;
  auVar190[8] = auVar114[4];
  Var68 = CONCAT91(CONCAT81(auVar190._8_8_,auVar379[3]),auVar114[3]);
  auVar98._2_10_ = Var68;
  auVar98[1] = auVar379[2];
  auVar98[0] = auVar114[2];
  auVar97._2_12_ = auVar98;
  auVar97[1] = auVar379[1];
  auVar97[0] = auVar114[1];
  auVar172._0_12_ = auVar162._0_12_;
  auVar172._12_2_ = (short)Var66;
  auVar172._14_2_ = (short)Var68;
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._0_10_ = auVar162._0_10_;
  auVar171._10_2_ = auVar98._0_2_;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._0_8_ = auVar162._0_8_;
  auVar170._8_2_ = auVar96._0_2_;
  auVar99._4_8_ = auVar170._8_8_;
  auVar99._2_2_ = auVar97._0_2_;
  auVar99._0_2_ = auVar95._0_2_;
  auVar197._0_8_ = auVar294._0_8_;
  auVar197._8_4_ = auVar94._0_4_;
  auVar197._12_4_ = auVar99._0_4_;
  auVar399[0xe] = auVar379[7];
  auVar399._0_14_ = auVar379;
  auVar399[0xf] = auVar114[7];
  auVar398._14_2_ = auVar399._14_2_;
  auVar398._0_13_ = auVar379._0_13_;
  auVar398[0xd] = auVar114[6];
  auVar397._13_3_ = auVar398._13_3_;
  auVar397._0_12_ = auVar379._0_12_;
  auVar397[0xc] = auVar379[6];
  auVar396._12_4_ = auVar397._12_4_;
  auVar396._0_11_ = auVar379._0_11_;
  auVar396[0xb] = auVar114[5];
  auVar395._11_5_ = auVar396._11_5_;
  auVar395._0_10_ = auVar379._0_10_;
  auVar395[10] = auVar379[5];
  auVar394._10_6_ = auVar395._10_6_;
  auVar394._0_9_ = auVar379._0_9_;
  auVar394[9] = auVar114[4];
  auVar393._9_7_ = auVar394._9_7_;
  auVar393._0_8_ = auVar379._0_8_;
  auVar393[8] = auVar379[4];
  auVar376[0xe] = auVar367[7];
  auVar376._0_14_ = auVar367;
  auVar376[0xf] = auVar179[7];
  auVar375._14_2_ = auVar376._14_2_;
  auVar375._0_13_ = auVar367._0_13_;
  auVar375[0xd] = auVar179[6];
  auVar374._13_3_ = auVar375._13_3_;
  auVar374._0_12_ = auVar367._0_12_;
  auVar374[0xc] = auVar367[6];
  auVar373._12_4_ = auVar374._12_4_;
  auVar373._0_11_ = auVar367._0_11_;
  auVar373[0xb] = auVar179[5];
  auVar372._11_5_ = auVar373._11_5_;
  auVar372._0_10_ = auVar367._0_10_;
  auVar372[10] = auVar367[5];
  auVar371._10_6_ = auVar372._10_6_;
  auVar371._0_9_ = auVar367._0_9_;
  auVar371[9] = auVar179[4];
  auVar370._9_7_ = auVar371._9_7_;
  auVar370._0_8_ = auVar367._0_8_;
  auVar370[8] = auVar367[4];
  uVar173 = CONCAT22(auVar370._8_2_,auVar393._8_2_);
  auVar378._0_8_ = CONCAT26(auVar372._10_2_,CONCAT24(auVar395._10_2_,uVar173));
  auVar378._8_2_ = auVar397._12_2_;
  auVar378._10_2_ = auVar374._12_2_;
  auVar400._12_2_ = auVar398._14_2_;
  auVar400._0_12_ = auVar378;
  auVar400._14_2_ = auVar375._14_2_;
  auVar350[0xe] = auVar403[7];
  auVar350._0_14_ = auVar403;
  auVar350[0xf] = auVar235[7];
  auVar349._14_2_ = auVar350._14_2_;
  auVar349._0_13_ = auVar403._0_13_;
  auVar349[0xd] = auVar235[6];
  auVar348._13_3_ = auVar349._13_3_;
  auVar348._0_12_ = auVar403._0_12_;
  auVar348[0xc] = auVar403[6];
  auVar347._12_4_ = auVar348._12_4_;
  auVar347._0_11_ = auVar403._0_11_;
  auVar347[0xb] = auVar235[5];
  auVar346._11_5_ = auVar347._11_5_;
  auVar346._0_10_ = auVar403._0_10_;
  auVar346[10] = auVar403[5];
  auVar345._10_6_ = auVar346._10_6_;
  auVar345._0_9_ = auVar403._0_9_;
  auVar345[9] = auVar235[4];
  auVar344._9_7_ = auVar345._9_7_;
  auVar344._0_8_ = auVar403._0_8_;
  auVar344[8] = auVar403[4];
  auVar268[0xe] = uVar59;
  auVar268[0xf] = puVar2[0xf];
  auVar267._14_2_ = auVar268._14_2_;
  auVar267[0xd] = auVar265[0xf];
  auVar267._0_13_ = auVar261._0_13_;
  auVar266._13_3_ = auVar267._13_3_;
  auVar266[0xc] = uVar153;
  auVar266._0_12_ = auVar251;
  auVar265._12_4_ = auVar266._12_4_;
  auVar265[0xb] = puVar1[0xf];
  auVar265._0_11_ = auVar251._0_11_;
  auVar264._11_5_ = auVar265._11_5_;
  auVar264[10] = uVar57;
  auVar264._0_10_ = auVar251._0_10_;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263[9] = auVar122[0xf];
  auVar263._0_9_ = auVar251._0_9_;
  auVar262._9_7_ = auVar263._9_7_;
  auVar262[8] = uVar247;
  auVar262._0_8_ = auVar251._0_8_;
  uVar134 = CONCAT22(auVar262._8_2_,auVar344._8_2_);
  auVar339._0_8_ = CONCAT26(auVar264._10_2_,CONCAT24(auVar346._10_2_,uVar134));
  auVar339._8_2_ = auVar348._12_2_;
  auVar339._10_2_ = auVar266._12_2_;
  auVar351._12_2_ = auVar349._14_2_;
  auVar351._0_12_ = auVar339;
  auVar351._14_2_ = auVar267._14_2_;
  auVar122._8_4_ = (int)((ulong)auVar378._0_8_ >> 0x20);
  auVar122._0_8_ = auVar378._0_8_;
  auVar122._12_4_ = (int)((ulong)auVar339._0_8_ >> 0x20);
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(CONCAT11(auVar379[0],auVar114[0]),uVar447),auVar294._0_4_);
  *(ulong *)s = CONCAT44(uVar134,uVar173);
  *(long *)(s + lVar111 + -8) = auVar197._8_8_;
  *(long *)(s + lVar111 + -8 + 8) = auVar122._8_8_;
  puVar1 = s + lVar111 * 2 + -8;
  *(int *)puVar1 = auVar295._8_4_;
  *(int *)(puVar1 + 4) = auVar170._8_4_;
  *(int *)(puVar1 + 8) = auVar378._8_4_;
  *(int *)(puVar1 + 0xc) = auVar339._8_4_;
  *(undefined4 *)(s + lVar3) = auVar296._12_4_;
  *(undefined4 *)(s + lVar3 + 4) = auVar171._12_4_;
  *(int *)(s + lVar3 + 8) = auVar400._12_4_;
  *(int *)(s + lVar3 + 0xc) = auVar351._12_4_;
  return;
}

Assistant:

void aom_lpf_vertical_14_sse2(unsigned char *s, int p,
                              const unsigned char *_blimit,
                              const unsigned char *_limit,
                              const unsigned char *_thresh) {
  __m128i q7p7, q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i x6, x5, x4, x3;
  __m128i pq0, pq1, pq2, pq3;
  __m128i blimit = _mm_load_si128((__m128i *)_blimit);
  __m128i limit = _mm_load_si128((__m128i *)_limit);
  __m128i thresh = _mm_load_si128((__m128i *)_thresh);

  x6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * p));

  transpose_pq_14_sse2(&x6, &x5, &x4, &x3, &q0p0, &q1p1, &q2p2, &q3p3, &q4p4,
                       &q5p5, &q6p6, &q7p7);

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  transpose_pq_14_inv_sse2(&q7p7, &q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1,
                           &q0p0, &pq0, &pq1, &pq2, &pq3);
  _mm_storeu_si128((__m128i *)(s - 8 + 0 * p), pq0);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * p), pq1);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * p), pq2);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * p), pq3);
}